

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpreter.cpp
# Opt level: O3

void __thiscall Interpreter::assign(Interpreter *this,void *data)

{
  *(undefined4 *)((long)this->res + (ulong)*data) = *(undefined4 *)((long)data + 4);
  return;
}

Assistant:

void Interpreter::assign(void *data) {
#ifdef I_DEBUG
    printf("assigning %f to $%i\n",
           *(float *) offset(data, 4),
           *(unsigned int *) data);
#endif
    memcpy(varAt(*(unsigned int *) data), offset(data, 4), 4);
}